

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O2

void rgba_5551_to_single_channel_8
               (void *src,int src_pitch,void *dst,int dst_pitch,int sx,int sy,int dx,int dy,
               int width,int height)

{
  undefined1 *puVar1;
  ushort *puVar2;
  undefined1 *puVar3;
  int iVar4;
  
  puVar2 = (ushort *)((long)src + (long)sx * 2 + (long)(sy * src_pitch));
  puVar3 = (undefined1 *)((long)dst + (long)(dy * dst_pitch) + (long)dx);
  iVar4 = 0;
  if (height < 1) {
    height = 0;
  }
  for (; iVar4 != height; iVar4 = iVar4 + 1) {
    puVar1 = puVar3 + width;
    for (; puVar3 < puVar1; puVar3 = puVar3 + 1) {
      *puVar3 = (char)_al_rgb_scale_5[*puVar2 >> 0xb];
      puVar2 = puVar2 + 1;
    }
    puVar2 = puVar2 + ((long)(src_pitch / 2) - (long)width);
    puVar3 = puVar3 + (dst_pitch - width);
  }
  return;
}

Assistant:

static void rgba_5551_to_single_channel_8(const void *src, int src_pitch,
   void *dst, int dst_pitch,
   int sx, int sy, int dx, int dy, int width, int height)
{
   int y;
   const uint16_t *src_ptr = (const uint16_t *)((const char *)src + sy * src_pitch);
   uint8_t *dst_ptr = (void *)((char *)dst + dy * dst_pitch);
   int src_gap = src_pitch / 2 - width;
   int dst_gap = dst_pitch / 1 - width;
   src_ptr += sx;
   dst_ptr += dx;
   for (y = 0; y < height; y++) {
      uint8_t *dst_end = dst_ptr + width;
      while (dst_ptr < dst_end) {
         *dst_ptr = ALLEGRO_CONVERT_RGBA_5551_TO_SINGLE_CHANNEL_8(*src_ptr);
         dst_ptr++;
         src_ptr++;
      }
      src_ptr += src_gap;
      dst_ptr += dst_gap;
   }
}